

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bias_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::Bias_x86_fma::forward_inplace(Bias_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  uint uVar6;
  long lVar7;
  undefined1 (*pauVar8) [32];
  int iVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 in_ZMM3 [64];
  float fVar15;
  float fVar17;
  float fVar18;
  undefined1 auVar16 [16];
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  
  auVar5 = _DAT_00555020;
  auVar4 = _DAT_00555000;
  iVar1 = bottom_top_blob->c;
  if (0 < (long)iVar1) {
    uVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    lVar2 = *(long *)(&this->field_0xd8 + (long)this->_vptr_Bias_x86_fma[-3]);
    lVar7 = 0;
    auVar14._8_8_ = 0x8000000000000000;
    auVar14._0_8_ = 0x8000000000000000;
    auVar3 = vpcmpeqd_avx(in_ZMM3._0_16_,in_ZMM3._0_16_);
    do {
      pauVar8 = (undefined1 (*) [32])
                (bottom_top_blob->cstep * lVar7 * bottom_top_blob->elemsize +
                (long)bottom_top_blob->data);
      fVar15 = *(float *)(lVar2 + lVar7 * 4);
      auVar16._4_4_ = fVar15;
      auVar16._0_4_ = fVar15;
      auVar16._8_4_ = fVar15;
      auVar16._12_4_ = fVar15;
      if ((int)uVar6 < 8) {
        uVar11 = 0;
      }
      else {
        iVar9 = 7;
        do {
          auVar22._0_4_ = fVar15 + *(float *)*pauVar8;
          auVar22._4_4_ = fVar15 + *(float *)((long)*pauVar8 + 4);
          auVar22._8_4_ = fVar15 + *(float *)((long)*pauVar8 + 8);
          auVar22._12_4_ = fVar15 + *(float *)((long)*pauVar8 + 0xc);
          auVar22._16_4_ = fVar15 + *(float *)((long)*pauVar8 + 0x10);
          auVar22._20_4_ = fVar15 + *(float *)((long)*pauVar8 + 0x14);
          auVar22._24_4_ = fVar15 + *(float *)((long)*pauVar8 + 0x18);
          auVar22._28_4_ = fVar15 + *(float *)((long)*pauVar8 + 0x1c);
          *pauVar8 = auVar22;
          pauVar8 = pauVar8 + 1;
          iVar9 = iVar9 + 8;
          uVar11 = uVar6 & 0xfffffff8;
        } while (iVar9 < (int)uVar6);
      }
      auVar16 = vshufps_avx(auVar16,auVar16,0);
      fVar15 = auVar16._0_4_;
      fVar17 = auVar16._4_4_;
      fVar18 = auVar16._8_4_;
      fVar19 = auVar16._12_4_;
      uVar10 = uVar11 | 3;
      while ((int)uVar10 < (int)uVar6) {
        auVar20._0_4_ = fVar15 + *(float *)*pauVar8;
        auVar20._4_4_ = fVar17 + *(float *)((long)*pauVar8 + 4);
        auVar20._8_4_ = fVar18 + *(float *)((long)*pauVar8 + 8);
        auVar20._12_4_ = fVar19 + *(float *)((long)*pauVar8 + 0xc);
        *(undefined1 (*) [16])*pauVar8 = auVar20;
        pauVar8 = (undefined1 (*) [32])((long)*pauVar8 + 0x10);
        uVar10 = uVar11 + 7;
        uVar11 = uVar11 + 4;
      }
      if ((int)uVar11 < (int)uVar6) {
        uVar12 = CONCAT44(0,~uVar11 + uVar6);
        auVar21._8_8_ = 0;
        auVar21._0_8_ = uVar12;
        auVar21 = vpshufd_avx(auVar21,0x44);
        auVar16 = vorps_avx(auVar21,auVar14);
        auVar20 = vorps_avx(auVar21,auVar14);
        auVar21 = vorps_avx(auVar21,auVar14);
        uVar13 = 0;
        do {
          auVar23._8_8_ = 0;
          auVar23._0_8_ = uVar13;
          auVar23 = vpshufd_avx(auVar23,0x44);
          auVar25._16_16_ = auVar23;
          auVar25._0_16_ = auVar23;
          auVar22 = vorps_avx(auVar25,auVar4);
          auVar25 = vorps_avx(auVar25,auVar5);
          auVar29._0_8_ = auVar25._16_8_ ^ 0x8000000000000000;
          auVar29._8_4_ = auVar25._24_4_;
          auVar29._12_4_ = auVar25._28_4_ ^ 0x80000000;
          auVar23 = vpcmpgtq_avx(auVar29,auVar16);
          auVar24._0_8_ = auVar25._0_8_ ^ 0x8000000000000000;
          auVar24._8_4_ = auVar25._8_4_;
          auVar24._12_4_ = auVar25._12_4_ ^ 0x80000000;
          auVar24 = vpcmpgtq_avx(auVar24,auVar20);
          auVar23 = vpackssdw_avx(auVar24,auVar23);
          auVar30._0_8_ = auVar22._16_8_ ^ 0x8000000000000000;
          auVar30._8_4_ = auVar22._24_4_;
          auVar30._12_4_ = auVar22._28_4_ ^ 0x80000000;
          auVar24 = vpcmpgtq_avx(auVar30,auVar16);
          auVar27._0_8_ = auVar22._0_8_ ^ 0x8000000000000000;
          auVar27._8_4_ = auVar22._8_4_;
          auVar27._12_4_ = auVar22._12_4_ ^ 0x80000000;
          auVar27 = vpcmpgtq_avx(auVar27,auVar21);
          auVar24 = vpackssdw_avx(auVar27,auVar24);
          auVar23 = vpackssdw_avx(auVar24 ^ auVar3,auVar23 ^ auVar3);
          auVar24 = vpmovsxwd_avx(auVar23);
          auVar23 = vpunpckhwd_avx(auVar23,auVar23);
          auVar26._16_16_ = auVar23;
          auVar26._0_16_ = auVar24;
          auVar22 = vmaskmovps_avx(auVar26,*(undefined1 (*) [32])((long)*pauVar8 + uVar13 * 4));
          auVar28._0_4_ = auVar22._0_4_ + fVar15;
          auVar28._4_4_ = auVar22._4_4_ + fVar17;
          auVar28._8_4_ = auVar22._8_4_ + fVar18;
          auVar28._12_4_ = auVar22._12_4_ + fVar19;
          auVar28._16_4_ = auVar22._16_4_ + fVar15;
          auVar28._20_4_ = auVar22._20_4_ + fVar17;
          auVar28._24_4_ = auVar22._24_4_ + fVar18;
          auVar28._28_4_ = auVar22._28_4_ + fVar19;
          auVar22 = vmaskmovps_avx(auVar26,auVar28);
          *(undefined1 (*) [32])((long)*pauVar8 + uVar13 * 4) = auVar22;
          uVar13 = uVar13 + 8;
        } while ((uVar12 + 8 & 0xfffffffffffffff8) != uVar13);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != iVar1);
  }
  return 0;
}

Assistant:

int Bias_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int size = w * h * d;

    const float* bias_ptr = bias_data;
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        float bias = bias_ptr[q];

        int i = 0;
#if __SSE2__
#if __AVX__
        {
            __m256 _bias256 = _mm256_set1_ps(bias);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _outp = _mm256_add_ps(_p, _bias256);
                _mm256_storeu_ps(ptr, _outp);

                ptr += 8;
            }
        }
#endif // __AVX__
        {
            __m128 _bias = _mm_set1_ps(bias);
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _outp = _mm_add_ps(_p, _bias);
                _mm_storeu_ps(ptr, _outp);

                ptr += 4;
            }
        }
#endif // __SSE2__

        for (; i < size; i++)
        {
            *ptr = *ptr + bias;

            ptr++;
        }
    }

    return 0;
}